

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O1

void __thiscall QHttpNetworkRequest::clearHeaders(QHttpNetworkRequest *this)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QHttpNetworkRequestPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(&this->d);
  }
  QHttpNetworkHeaderPrivate::clearHeaders(&((this->d).d.ptr)->super_QHttpNetworkHeaderPrivate);
  return;
}

Assistant:

void QHttpNetworkRequest::clearHeaders()
{
    d->clearHeaders();
}